

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphical_model.h
# Opt level: O0

ssize_t __thiscall
merlin::graphical_model::write(graphical_model *this,int __fd,void *__buf,size_t __n)

{
  const_iterator ci;
  bool bVar1;
  _Setiosflags _Var2;
  _Setprecision _Var3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  size_type sVar7;
  reference pvVar8;
  factor *pfVar9;
  variable_set *pvVar10;
  reference this_00;
  undefined4 in_register_00000034;
  ostream *this_01;
  value vVar11;
  ulong local_98;
  size_t j;
  factor *f_1;
  size_t i_2;
  const_iterator local_70;
  undefined1 local_50 [8];
  const_iterator si;
  factor *f;
  size_t i_1;
  size_t i;
  ostream *os_local;
  graphical_model *this_local;
  
  this_01 = (ostream *)CONCAT44(in_register_00000034,__fd);
  poVar4 = std::operator<<(this_01,"MARKOV");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  sVar5 = nvar(this);
  pvVar6 = (void *)std::ostream::operator<<(this_01,sVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  i_1 = 0;
  while( true ) {
    sVar7 = std::vector<double,_std::allocator<double>_>::size(&this->m_dims);
    if (sVar7 <= i_1) break;
    pvVar8 = std::vector<double,_std::allocator<double>_>::operator[](&this->m_dims,i_1);
    poVar4 = (ostream *)std::ostream::operator<<(this_01,*pvVar8);
    std::operator<<(poVar4," ");
    i_1 = i_1 + 1;
  }
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  sVar5 = num_factors(this);
  pvVar6 = (void *)std::ostream::operator<<(this_01,sVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  f = (factor *)0x0;
  while( true ) {
    pfVar9 = (factor *)
             std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size(&this->m_factors);
    if (pfVar9 <= f) break;
    si.m_tmp.m_states =
         (size_t)std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                           (&this->m_factors,(size_type)f);
    sVar5 = factor::nvar((factor *)si.m_tmp.m_states);
    std::ostream::operator<<(this_01,sVar5);
    pvVar10 = factor::vars((factor *)si.m_tmp.m_states);
    variable_set::begin((const_iterator *)local_50,pvVar10);
    while( true ) {
      pvVar10 = factor::vars((factor *)si.m_tmp.m_states);
      variable_set::end(&local_70,pvVar10);
      ci.m_vs = local_70.m_vs;
      ci.m_i = local_70.m_i;
      ci.m_tmp.m_label = local_70.m_tmp.m_label;
      ci.m_tmp.m_states = local_70.m_tmp.m_states;
      bVar1 = variable_set::const_iterator::operator!=((const_iterator *)local_50,ci);
      if (!bVar1) break;
      poVar4 = std::operator<<(this_01," ");
      _i_2 = variable_set::const_iterator::operator*((const_iterator *)local_50);
      sVar5 = variable::label((variable *)&i_2);
      std::ostream::operator<<(poVar4,sVar5);
      variable_set::const_iterator::operator++((const_iterator *)local_50);
    }
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    f = (factor *)((long)&f->_vptr_factor + 1);
  }
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  f_1 = (factor *)0x0;
  while( true ) {
    pfVar9 = (factor *)
             std::vector<merlin::factor,_std::allocator<merlin::factor>_>::size(&this->m_factors);
    if (pfVar9 <= f_1) break;
    this_00 = std::vector<merlin::factor,_std::allocator<merlin::factor>_>::operator[]
                        (&this->m_factors,(size_type)f_1);
    sVar5 = factor::numel(this_00);
    pvVar6 = (void *)std::ostream::operator<<(this_01,sVar5);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    local_98 = 0;
    while( true ) {
      sVar5 = factor::numel(this_00);
      if (sVar5 <= local_98) break;
      poVar4 = std::operator<<(this_01," ");
      _Var2 = std::setiosflags(_S_fixed);
      poVar4 = std::operator<<(poVar4,_Var2);
      _Var3 = std::setprecision(8);
      poVar4 = std::operator<<(poVar4,_Var3);
      vVar11 = factor::operator[](this_00,local_98);
      std::ostream::operator<<(poVar4,vVar11);
      local_98 = local_98 + 1;
    }
    pvVar6 = (void *)std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
    f_1 = (factor *)((long)&f_1->_vptr_factor + 1);
  }
  return (ssize_t)f_1;
}

Assistant:

void write(std::ostream& os) {

		// Write the header
		os << "MARKOV" << std::endl;
		os << nvar() << std::endl;
		for (size_t i = 0; i < m_dims.size(); ++i) {
			os << m_dims[i] << " ";
		}
		os << std::endl;

		// Write the factor scopes
		os << num_factors() << std::endl;
		for (size_t i = 0; i < m_factors.size(); ++i) {
			const factor& f = m_factors[i];
			os << f.nvar();
			variable_set::const_iterator si = f.vars().begin();
			for (; si != f.vars().end(); ++si) {
				os << " " << (*si).label();
			}
			os << std::endl;
		}

		// Write the factor tables
		os << std::endl;
		for (size_t i = 0; i < m_factors.size(); ++i) {
			const factor& f = m_factors[i];
			os << f.numel() << std::endl;
			for (size_t j = 0; j < f.numel(); ++j) {
				os << " " << std::setiosflags(std::ios::fixed)
					<< std::setprecision(8) << f[j];
			}
			os << std::endl << std::endl;
		}
	}